

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O0

void __thiscall
MeanField::CPU::CRF::runInference(CRF *this,uchar *image,float *unaries,int iterations)

{
  pointer pfVar1;
  int local_28;
  int i;
  int iterations_local;
  float *unaries_local;
  uchar *image_local;
  CRF *this_local;
  
  (*(this->super_CRF)._vptr_CRF[7])(this,image,unaries);
  for (local_28 = 0; local_28 < iterations + -1; local_28 = local_28 + 1) {
    pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->QDistribution);
    (*(this->super_CRF)._vptr_CRF[7])(this,image,pfVar1);
  }
  return;
}

Assistant:

void CRF::runInference(const unsigned char *image, const float *unaries, int iterations) {
    runInferenceIteration(image, unaries);
    for (int i = 0; i < iterations - 1; i++) {
        runInferenceIteration(image, QDistribution.get());
    }
}